

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# econ.cpp
# Opt level: O0

int CEcon::NewClientCallback(int ClientID,void *pUser)

{
  long lVar1;
  IConsole *pIVar2;
  int64 iVar3;
  CEcon *in_RSI;
  uint in_EDI;
  long in_FS_OFFSET;
  CEcon *pThis;
  char aBuf [128];
  char aAddrStr [48];
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  CNetConsole *in_stack_ffffffffffffff10;
  undefined1 *puVar4;
  int ClientID_00;
  undefined4 in_stack_ffffffffffffff18;
  uint uVar5;
  CEcon *pCVar6;
  undefined4 in_stack_ffffffffffffff40;
  NETADDR *in_stack_ffffffffffffff48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar6 = in_RSI;
  CNetConsole::ClientAddr(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  puVar4 = &stack0xffffffffffffffc8;
  uVar5 = 1;
  net_addr_str(in_stack_ffffffffffffff48,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffff40),
               (int)((ulong)pCVar6 >> 0x20),(int)pCVar6);
  str_format(&stack0xffffffffffffff48,0x80,"client accepted. cid=%d addr=%s\'",(ulong)in_EDI,puVar4)
  ;
  ClientID_00 = (int)((ulong)puVar4 >> 0x20);
  pIVar2 = Console(in_RSI);
  (*(pIVar2->super_IInterface)._vptr_IInterface[0x19])
            (pIVar2,(ulong)uVar5,"econ",&stack0xffffffffffffff48,0);
  in_RSI->m_aClients[(int)in_EDI].m_State = 1;
  iVar3 = time_get();
  in_RSI->m_aClients[(int)in_EDI].m_TimeConnected = iVar3;
  in_RSI->m_aClients[(int)in_EDI].m_AuthTries = 0;
  CNetConsole::Send((CNetConsole *)CONCAT44(uVar5,in_stack_ffffffffffffff18),ClientID_00,
                    (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int CEcon::NewClientCallback(int ClientID, void *pUser)
{
	CEcon *pThis = (CEcon *)pUser;

	char aAddrStr[NETADDR_MAXSTRSIZE];
	net_addr_str(pThis->m_NetConsole.ClientAddr(ClientID), aAddrStr, sizeof(aAddrStr), true);
	char aBuf[128];
	str_format(aBuf, sizeof(aBuf), "client accepted. cid=%d addr=%s'", ClientID, aAddrStr);
	pThis->Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "econ", aBuf);

	pThis->m_aClients[ClientID].m_State = CClient::STATE_CONNECTED;
	pThis->m_aClients[ClientID].m_TimeConnected = time_get();
	pThis->m_aClients[ClientID].m_AuthTries = 0;

	pThis->m_NetConsole.Send(ClientID, "Enter password:");
	return 0;
}